

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

_Bool fy_node_compare_user
                (fy_node *fyn1,fy_node *fyn2,fy_node_mapping_sort_fn sort_fn,void *sort_fn_arg,
                fy_node_scalar_compare_fn cmp_fn,void *cmp_fn_arg)

{
  fy_token *pfVar1;
  fy_node_pair *pfVar2;
  fy_node_pair *pfVar3;
  fy_node *pfVar4;
  fy_node *pfVar5;
  fy_node_mapping_sort_fn key_cmp;
  fy_node_pair **arg;
  byte bVar6;
  _Bool _Var7;
  _Bool _Var8;
  uint count;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  fy_node_pair **fynpp;
  ulong uVar13;
  code *pcVar14;
  fy_token *fyn1_00;
  fy_token *fyn2_00;
  fy_node_pair **fynpp_00;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  fy_node_pair *apfStack_70 [2];
  fy_node_scalar_compare_fn local_60;
  void *local_58;
  fy_node_mapping_sort_fn local_50;
  fy_node_pair **local_48;
  fy_node *local_40;
  fy_node_pair **local_38;
  
  if (cmp_fn == (fy_node_scalar_compare_fn)0x0) {
    cmp_fn_arg = (void *)0x0;
  }
  pcVar14 = fy_node_scalar_cmp_default;
  if (cmp_fn != (fy_node_scalar_compare_fn)0x0) {
    pcVar14 = cmp_fn;
  }
  if (sort_fn == (fy_node_mapping_sort_fn)0x0) {
    sort_fn_arg = &local_60;
    local_60 = pcVar14;
    sort_fn = fy_node_mapping_sort_cmp_default;
    local_58 = cmp_fn_arg;
  }
  else {
    local_60 = (fy_node_scalar_compare_fn)0x0;
    local_58 = (void *)0x0;
  }
  if (fyn1 == fyn2) {
switchD_0011cc25_caseD_3:
    uVar15 = 1;
    goto LAB_0011cc4e;
  }
  bVar17 = true;
  bVar16 = true;
  local_50 = sort_fn;
  local_38 = (fy_node_pair **)sort_fn_arg;
  if (fyn1 != (fy_node *)0x0) {
    if ((fyn1->field_0x34 & 3) == 0) {
      apfStack_70[0] = (fy_node_pair *)0x11cbbc;
      sVar11 = fy_token_get_text_length((fyn1->field_12).scalar);
      bVar16 = sVar11 == 0;
    }
    else {
      bVar16 = false;
    }
  }
  if (fyn2 == (fy_node *)0x0) {
LAB_0011cbf3:
    uVar15 = 1;
    if ((bool)(bVar16 & bVar17)) goto LAB_0011cc4e;
  }
  else {
    if ((fyn2->field_0x34 & 3) == 0) {
      apfStack_70[0] = (fy_node_pair *)0x11cbe7;
      sVar11 = fy_token_get_text_length((fyn2->field_12).scalar);
      bVar17 = sVar11 == 0;
      goto LAB_0011cbf3;
    }
    bVar17 = false;
  }
  if ((bVar16 || bVar17) || (bVar6 = fyn1->field_0x34 & 3, bVar6 != (fyn2->field_0x34 & 3))) {
LAB_0011cc46:
    uVar15 = 0;
  }
  else {
    switch(bVar6) {
    case 0:
      apfStack_70[0] = (fy_node_pair *)0x11cc32;
      _Var8 = fy_node_is_alias(fyn1);
      apfStack_70[0] = (fy_node_pair *)0x11cc3d;
      _Var7 = fy_node_is_alias(fyn2);
      if (_Var8 == _Var7) {
        apfStack_70[0] = (fy_node_pair *)0x11cdb7;
        iVar10 = (*pcVar14)(fyn1,fyn2,cmp_fn_arg);
        uVar15 = (ulong)(iVar10 == 0);
        break;
      }
      goto LAB_0011cc46;
    case 1:
      fyn1_00 = (fy_token *)0x0;
      if ((fyn1->field_12).scalar != (fy_token *)&fyn1->field_12) {
        fyn1_00 = (fyn1->field_12).scalar;
      }
      fyn2_00 = (fy_token *)&fyn2->field_12;
      while( true ) {
        pfVar1 = (fy_token *)(fyn2_00->node).next;
        fyn2_00 = (fy_token *)0x0;
        if (pfVar1 != (fy_token *)&fyn2->field_12) {
          fyn2_00 = pfVar1;
        }
        bVar17 = fyn2_00 == (fy_token *)0x0 || fyn1_00 == (fy_token *)0x0;
        if (bVar17) break;
        apfStack_70[0] = (fy_node_pair *)0x11ccad;
        _Var8 = fy_node_compare((fy_node *)fyn1_00,(fy_node *)fyn2_00);
        if (!_Var8) break;
        pfVar1 = (fy_token *)(fyn1_00->node).next;
        fyn1_00 = (fy_token *)0x0;
        if (pfVar1 != (fy_token *)&fyn1->field_12) {
          fyn1_00 = pfVar1;
        }
      }
      uVar15 = (ulong)(bVar17 && fyn1_00 == fyn2_00);
      break;
    case 2:
      apfStack_70[0] = (fy_node_pair *)0x11cce3;
      count = fy_node_mapping_item_count(fyn1);
      apfStack_70[0] = (fy_node_pair *)0x11ccee;
      uVar9 = fy_node_mapping_item_count(fyn2);
      arg = local_38;
      key_cmp = local_50;
      uVar15 = 0;
      if (count == uVar9) {
        uVar12 = (long)(int)count * 8 + 0x17U & 0xfffffffffffffff0;
        fynpp = (fy_node_pair **)((long)apfStack_70 + (8 - uVar12));
        fynpp_00 = (fy_node_pair **)((long)fynpp - uVar12);
        local_48 = fynpp;
        local_40 = fyn2;
        fynpp_00[-1] = (fy_node_pair *)0x11cd3c;
        fy_node_mapping_perform_sort(fyn1,key_cmp,arg,fynpp,count);
        pfVar4 = local_40;
        local_38 = fynpp_00;
        fynpp_00[-1] = (fy_node_pair *)0x11cd55;
        fy_node_mapping_perform_sort(pfVar4,key_cmp,arg,fynpp_00,count);
        uVar12 = (ulong)count;
        if ((int)count < 1) {
          uVar12 = uVar15;
        }
        uVar13 = 0;
        do {
          uVar15 = (ulong)(uVar12 == uVar13);
          if (uVar12 == uVar13) break;
          pfVar2 = local_48[uVar13];
          pfVar3 = local_38[uVar13];
          pfVar4 = pfVar2->key;
          pfVar5 = pfVar3->key;
          fynpp_00[-1] = (fy_node_pair *)0x11cd89;
          _Var8 = fy_node_compare(pfVar4,pfVar5);
          if (!_Var8) break;
          pfVar4 = pfVar2->value;
          pfVar5 = pfVar3->value;
          fynpp_00[-1] = (fy_node_pair *)0x11cd9f;
          _Var8 = fy_node_compare(pfVar4,pfVar5);
          uVar13 = uVar13 + 1;
        } while (_Var8);
      }
      break;
    case 3:
      goto switchD_0011cc25_caseD_3;
    }
  }
LAB_0011cc4e:
  return SUB81(uVar15,0);
}

Assistant:

bool fy_node_compare_user(struct fy_node *fyn1, struct fy_node *fyn2,
                          fy_node_mapping_sort_fn sort_fn, void *sort_fn_arg,
                          fy_node_scalar_compare_fn cmp_fn, void *cmp_fn_arg) {
    struct fy_node *fyni1, *fyni2;
    struct fy_node_pair *fynp1, *fynp2;
    bool ret, null1, null2;
    struct fy_node_pair **fynpp1, **fynpp2;
    int i, count1, count2;
    bool alias1, alias2;
    struct fy_node_cmp_arg def_arg;

    if (!cmp_fn) {
        cmp_fn = fy_node_scalar_cmp_default;
        cmp_fn_arg = NULL;
    }
    if (!sort_fn) {
        sort_fn = fy_node_mapping_sort_cmp_default;
        def_arg.cmp_fn = cmp_fn;
        def_arg.arg = cmp_fn_arg;
        sort_fn_arg = &def_arg;
    } else {
        def_arg.cmp_fn = NULL;
        def_arg.arg = NULL;
    }
    /* equal pointers? */
    if (fyn1 == fyn2)
        return true;

    null1 = !fyn1 || (fyn1->type == FYNT_SCALAR && fy_token_get_text_length(fyn1->scalar) == 0);
    null2 = !fyn2 || (fyn2->type == FYNT_SCALAR && fy_token_get_text_length(fyn2->scalar) == 0);

    /* both null */
    if (null1 && null2)
        return true;

    /* either is NULL, no match */
    if (null1 || null2)
        return false;

    /* types must match */
    if (fyn1->type != fyn2->type)
        return false;

    ret = true;

    switch (fyn1->type) {
        case FYNT_SEQUENCE:
            fyni1 = fy_node_list_head(&fyn1->sequence);
            fyni2 = fy_node_list_head(&fyn2->sequence);
            while (fyni1 && fyni2) {

                ret = fy_node_compare(fyni1, fyni2);
                if (!ret)
                    break;

                fyni1 = fy_node_next(&fyn1->sequence, fyni1);
                fyni2 = fy_node_next(&fyn2->sequence, fyni2);
            }
            if (ret && fyni1 != fyni2 && (!fyni1 || !fyni2))
                ret = false;

            break;

        case FYNT_MAPPING:
            count1 = fy_node_mapping_item_count(fyn1);
            count2 = fy_node_mapping_item_count(fyn2);

            /* mapping counts must match */
            if (count1 != count2) {
                ret = false;
                break;
            }

            fynpp1 = alloca(sizeof(*fynpp1) * (count1 + 1));
            fynpp2 = alloca(sizeof(*fynpp2) * (count2 + 1));

            fy_node_mapping_perform_sort(fyn1, sort_fn, sort_fn_arg, fynpp1, count1);
            fy_node_mapping_perform_sort(fyn2, sort_fn, sort_fn_arg, fynpp2, count2);

            for (i = 0; i < count1; i++) {
                fynp1 = fynpp1[i];
                fynp2 = fynpp2[i];

                ret = fy_node_compare(fynp1->key, fynp2->key);
                if (!ret)
                    break;

                ret = fy_node_compare(fynp1->value, fynp2->value);
                if (!ret)
                    break;
            }
            if (i >= count1)
                ret = true;

            break;

        case FYNT_SCALAR:
            alias1 = fy_node_is_alias(fyn1);
            alias2 = fy_node_is_alias(fyn2);

            /* either both must be aliases or both not */
            if (alias1 != alias2)
                return false;

            ret = !cmp_fn(fyn1, fyn2, cmp_fn_arg);
            break;
    }

    return ret;
}